

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::SetCheckCodeGenEntryPoint
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo,JavascriptMethod entryPoint)

{
  JavascriptMethod p_Var1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  void *pvVar6;
  EntryPointInfo *this_00;
  JavascriptMethod p_Var7;
  
  BVar4 = IsIntermediateCodeGenThunk(entryPoint);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xedc,"(IsIntermediateCodeGenThunk(entryPoint))",
                                "IsIntermediateCodeGenThunk(entryPoint)");
    if (!bVar3) goto LAB_00765b4e;
    *puVar5 = 0;
  }
  if ((entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod !=
      (Type)((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk)
  {
    if ((FunctionEntryPointInfo *)
        (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr ==
        entryPointInfo) {
      BVar4 = IsInterpreterThunk(this);
      if (BVar4 != 0) goto LAB_00765b41;
    }
    pvVar6 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,SimpleJitEntryPointInfo);
    if (pvVar6 != (void *)0x0) {
      p_Var1 = (JavascriptMethod)
               (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod;
      this_00 = (EntryPointInfo *)
                FunctionProxy::GetAuxPtr((FunctionProxy *)this,SimpleJitEntryPointInfo);
      p_Var7 = EntryPointInfo::GetNativeEntrypoint(this_00);
      if (p_Var1 == p_Var7) goto LAB_00765b41;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xee3,
                                "(this->GetEntryPoint(entryPointInfo) == m_scriptContext->CurrentThunk || (entryPointInfo == this->m_defaultEntryPointInfo && this->IsInterpreterThunk()) || ( GetSimpleJitEntryPointInfo() && GetEntryPoint(entryPointInfo) == GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() ))"
                                ,
                                "this->GetEntryPoint(entryPointInfo) == m_scriptContext->CurrentThunk || (entryPointInfo == this->m_defaultEntryPointInfo && this->IsInterpreterThunk()) || ( GetSimpleJitEntryPointInfo() && GetEntryPoint(entryPointInfo) == GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() )"
                               );
    if (!bVar3) {
LAB_00765b4e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
LAB_00765b41:
  (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod = (Type)entryPoint;
  return;
}

Assistant:

void FunctionBody::SetCheckCodeGenEntryPoint(FunctionEntryPointInfo* entryPointInfo, JavascriptMethod entryPoint)
    {
        Assert(IsIntermediateCodeGenThunk(entryPoint));
        Assert(
            this->GetEntryPoint(entryPointInfo) == m_scriptContext->CurrentThunk ||
            (entryPointInfo == this->m_defaultEntryPointInfo && this->IsInterpreterThunk()) ||
            (
                GetSimpleJitEntryPointInfo() &&
                GetEntryPoint(entryPointInfo) == GetSimpleJitEntryPointInfo()->GetNativeEntrypoint()
            ));
        this->SetEntryPoint(entryPointInfo, entryPoint);
    }